

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O0

BOOL __thiscall
Js::DynamicObject::ToPrimitive
          (DynamicObject *this,JavascriptHint hint,Var *result,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  bool local_3a;
  bool local_39;
  ScriptContext *requestContext_local;
  Var *result_local;
  JavascriptHint hint_local;
  DynamicObject *this_local;
  
  if (hint == HintString) {
    BVar3 = ToPrimitiveImpl<376>(this,result,requestContext);
    local_39 = true;
    local_3a = local_39;
    if (BVar3 == 0) {
      BVar3 = ToPrimitiveImpl<398>(this,result,requestContext);
      local_3a = BVar3 != 0;
    }
  }
  else {
    if ((hint != None) && (hint != HintNumber)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                  ,0x18c,
                                  "(hint == JavascriptHint::None || hint == JavascriptHint::HintNumber)"
                                  ,
                                  "hint == JavascriptHint::None || hint == JavascriptHint::HintNumber"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    BVar3 = ToPrimitiveImpl<398>(this,result,requestContext);
    local_3a = true;
    if (BVar3 == 0) {
      BVar3 = ToPrimitiveImpl<376>(this,result,requestContext);
      local_3a = BVar3 != 0;
    }
  }
  this_local._4_4_ = (uint)local_3a;
  return this_local._4_4_;
}

Assistant:

BOOL DynamicObject::ToPrimitive(JavascriptHint hint, Var* result, ScriptContext * requestContext)
    {
        if(hint == JavascriptHint::HintString)
        {
            return ToPrimitiveImpl<PropertyIds::toString>(result, requestContext)
                || ToPrimitiveImpl<PropertyIds::valueOf>(result, requestContext);
        }
        else
        {
            Assert(hint == JavascriptHint::None || hint == JavascriptHint::HintNumber);
            return ToPrimitiveImpl<PropertyIds::valueOf>(result, requestContext)
                || ToPrimitiveImpl<PropertyIds::toString>(result, requestContext);

        }
    }